

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O2

void ecs_query_notify(ecs_world_t *world,ecs_query_t *query,ecs_query_event_t *event)

{
  ecs_query_t *peVar1;
  ecs_sparse_t *sparse;
  _Bool _Var2;
  uint uVar3;
  int32_t iVar4;
  void *pvVar5;
  ulong uVar6;
  ecs_table_t *peVar7;
  ulong uVar8;
  int dense_index;
  
  switch(event->kind) {
  case EcsQueryTableMatch:
    _Var2 = match_table(world,query,event->table);
    if ((!_Var2) || (query->subqueries == (ecs_vector_t *)0x0)) {
      return;
    }
    break;
  case EcsQueryTableEmpty:
    peVar7 = event->table;
    _Var2 = false;
    goto LAB_00117871;
  case EcsQueryTableNonEmpty:
    peVar7 = event->table;
    _Var2 = true;
LAB_00117871:
    activate_table(world,query,peVar7,_Var2);
    break;
  case EcsQueryTableRematch:
    peVar1 = event->parent_query;
    if (peVar1 == (ecs_query_t *)0x0) {
      sparse = (world->store).tables;
      iVar4 = ecs_sparse_count(sparse);
      dense_index = 0;
      if (iVar4 < 1) {
        iVar4 = dense_index;
      }
      for (; iVar4 != dense_index; dense_index = dense_index + 1) {
        peVar7 = (ecs_table_t *)_ecs_sparse_get(sparse,0x80,dense_index);
        rematch_table(world,query,peVar7);
      }
    }
    else {
      pvVar5 = _ecs_vector_first(peVar1->tables,0x50,0x10);
      uVar3 = ecs_vector_count(peVar1->tables);
      uVar8 = 0;
      uVar6 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar6 = uVar8;
      }
      for (; uVar6 * 0x50 - uVar8 != 0; uVar8 = uVar8 + 0x50) {
        rematch_table(world,query,*(ecs_table_t **)((long)pvVar5 + uVar8 + 8));
      }
      pvVar5 = _ecs_vector_first(peVar1->empty_tables,0x50,0x10);
      uVar3 = ecs_vector_count(peVar1->empty_tables);
      uVar8 = 0;
      uVar6 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar6 = uVar8;
      }
      for (; uVar6 * 0x50 - uVar8 != 0; uVar8 = uVar8 + 0x50) {
        rematch_table(world,query,*(ecs_table_t **)((long)pvVar5 + uVar8 + 8));
      }
    }
    group_tables(world,query);
    order_ranked_tables(world,query);
    if (query->system != 0) {
      _Var2 = ecs_sig_check_constraints(world,&query->sig);
      if (_Var2) {
        ecs_remove_entity(world,query->system,0x104);
      }
      else {
        ecs_add_entity(world,query->system,0x104);
      }
    }
    break;
  case EcsQueryTableUnmatch:
    unmatch_table(query,event->table,(ecs_table_indices_t *)0x0);
    break;
  case EcsQueryOrphan:
    _ecs_assert((_Bool)((byte)(query->flags >> 8) & 1),0xc,(char *)0x0,
                "query->flags & EcsQueryIsSubquery",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                ,0x86b);
    if ((query->flags >> 8 & 1) == 0) {
      __assert_fail("query->flags & (256)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                    ,0x86b,
                    "void ecs_query_notify(ecs_world_t *, ecs_query_t *, ecs_query_event_t *)");
    }
    query->flags = query->flags | 0x200;
    query->parent = (ecs_query_t *)0x0;
  }
  notify_subqueries(world,query,event);
  return;
}

Assistant:

void ecs_query_notify(
    ecs_world_t *world,
    ecs_query_t *query,
    ecs_query_event_t *event)
{
    bool notify = true;

    switch(event->kind) {
    case EcsQueryTableMatch:
        /* Creation of new table */
        if (match_table(world, query, event->table)) {
            if (query->subqueries) {
                notify_subqueries(world, query, event);
            }
        }
        notify = false;
        break;
    case EcsQueryTableUnmatch:
        /* Deletion of table */
        unmatch_table(query, event->table, NULL);
        break;
    case EcsQueryTableRematch:
        /* Rematch tables of query */
        rematch_tables(world, query, event->parent_query);
        break;        
    case EcsQueryTableEmpty:
        /* Table is empty, deactivate */
        activate_table(world, query, event->table, false);
        break;
    case EcsQueryTableNonEmpty:
        /* Table is non-empty, activate */
        activate_table(world, query, event->table, true);
        break;
    case EcsQueryOrphan:
        ecs_assert(query->flags & EcsQueryIsSubquery, ECS_INTERNAL_ERROR, NULL);
        query->flags |= EcsQueryIsOrphaned;
        query->parent = NULL;
        break;
    }

    if (notify) {
        notify_subqueries(world, query, event);
    }
}